

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_write(anm_archive_t *anm,char *filename)

{
  long *plVar1;
  void *pvVar2;
  anm_instr_t aVar3;
  short *buffer;
  int iVar4;
  char *pcVar5;
  FILE *__stream;
  FILE *__stream_00;
  int *piVar6;
  char *pcVar7;
  long offset;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  undefined8 *local_b0;
  list_node_t *node_6;
  undefined8 uStack_a0;
  uint32_t ofs;
  anm_instr_t sentinel_1;
  anm_instr0_t sentinel;
  anm_instr0_t new_instr;
  list_node_t *node_5;
  anm_instr_t *instr;
  list_node_t *node_4;
  list_node_t *node_3;
  list_node_t *node_2;
  undefined8 *puStack_60;
  uint script_count;
  list_node_t *node_1;
  uint sprite_count;
  uint spriteoffset;
  uint j;
  uint namepad;
  long base;
  anm_script_t *script;
  sprite_t *sprite;
  list_node_t *node;
  anm_entry_t *entry;
  FILE *stream;
  char *filename_local;
  anm_archive_t *anm_local;
  
  __stream_00 = fopen(filename,"wb");
  __stream = _stderr;
  pcVar5 = argv0;
  if (__stream_00 != (FILE *)0x0) {
    for (sprite = (sprite_t *)(anm->entries).head; sprite != (sprite_t *)0x0;
        sprite = *(sprite_t **)sprite) {
      plVar1 = *(long **)&sprite->h;
      offset = file_tell((FILE *)__stream_00);
      sVar8 = strlen((char *)plVar1[2]);
      node_1._0_4_ = 0;
      for (puStack_60 = (undefined8 *)plVar1[4]; puStack_60 != (undefined8 *)0x0;
          puStack_60 = (undefined8 *)*puStack_60) {
        node_1._0_4_ = (uint)node_1 + 1;
      }
      node_2._4_4_ = 0;
      for (node_3 = (list_node_t *)plVar1[6]; node_3 != (list_node_t *)0x0; node_3 = node_3->next) {
        node_2._4_4_ = node_2._4_4_ + 1;
      }
      file_seek((FILE *)__stream_00,
                offset + 0x40 + (ulong)(uint)node_1 * 4 + (ulong)node_2._4_4_ * 8);
      lVar9 = file_tell((FILE *)__stream_00);
      iVar4 = (int)offset;
      *(int *)(*plVar1 + 0x1c) = (int)lVar9 - iVar4;
      pvVar2 = (void *)plVar1[2];
      sVar10 = strlen((char *)plVar1[2]);
      file_write((FILE *)__stream_00,pvVar2,sVar10);
      file_write((FILE *)__stream_00,"",(ulong)(0x10 - ((uint)sVar8 & 0xf)));
      if ((plVar1[3] != 0) && (*(int *)(*plVar1 + 0x28) == 0)) {
        sVar8 = strlen((char *)plVar1[3]);
        lVar9 = file_tell((FILE *)__stream_00);
        *(int *)(*plVar1 + 0x24) = (int)lVar9 - iVar4;
        pvVar2 = (void *)plVar1[3];
        sVar10 = strlen((char *)plVar1[3]);
        file_write((FILE *)__stream_00,pvVar2,sVar10);
        file_write((FILE *)__stream_00,"",(ulong)(0x10 - ((uint)sVar8 & 0xf)));
      }
      lVar9 = file_tell((FILE *)__stream_00);
      for (node_4 = (list_node_t *)plVar1[4]; node_4 != (list_node_t *)0x0; node_4 = node_4->next) {
        file_write((FILE *)__stream_00,node_4->data,0x14);
      }
      for (instr = (anm_instr_t *)plVar1[6]; instr != (anm_instr_t *)0x0;
          instr = *(anm_instr_t **)instr) {
        aVar3 = instr[2];
        lVar11 = file_tell((FILE *)__stream_00);
        *(int *)(*(long *)aVar3 + 4) = (int)lVar11 - iVar4;
        for (_sentinel = *(undefined8 **)((long)aVar3 + 8); _sentinel != (undefined8 *)0x0;
            _sentinel = (undefined8 *)*_sentinel) {
          buffer = (short *)_sentinel[2];
          if (*(int *)(*plVar1 + 0x28) == 0) {
            sentinel_1.time = buffer[2];
            sentinel_1.param_mask._0_1_ = (undefined1)*buffer;
            sentinel_1.param_mask._1_1_ = (byte)buffer[1];
            file_write((FILE *)__stream_00,&sentinel_1.time,4);
            if (sentinel_1.param_mask._1_1_ != 0) {
              file_write((FILE *)__stream_00,buffer + 4,(ulong)sentinel_1.param_mask._1_1_);
            }
          }
          else if (*buffer == -1) {
            buffer[1] = 0;
            file_write((FILE *)__stream_00,buffer,8);
          }
          else {
            buffer[1] = buffer[1] + 8;
            file_write((FILE *)__stream_00,buffer,(ulong)(ushort)buffer[1]);
          }
        }
        if (*(int *)(*plVar1 + 0x28) == 0) {
          memset(&sentinel_1,0,4);
          file_write((FILE *)__stream_00,&sentinel_1,4);
        }
        else {
          uStack_a0 = 0xffff;
          file_write((FILE *)__stream_00,&stack0xffffffffffffff60,8);
        }
      }
      if (*(short *)(*plVar1 + 0x34) != 0) {
        lVar11 = file_tell((FILE *)__stream_00);
        *(int *)(*plVar1 + 0x30) = (int)lVar11 - iVar4;
        file_write((FILE *)__stream_00,(void *)plVar1[1],0x10);
        file_write((FILE *)__stream_00,(void *)plVar1[8],(ulong)*(uint *)(plVar1[1] + 0xc));
      }
      lVar11._0_4_ = sprite->id;
      lVar11._4_4_ = sprite->x;
      if (lVar11 == 0) {
        *(undefined4 *)(*plVar1 + 0x38) = 0;
      }
      else {
        lVar11 = file_tell((FILE *)__stream_00);
        *(int *)(*plVar1 + 0x38) = (int)lVar11 - iVar4;
      }
      *(uint *)*plVar1 = (uint)node_1;
      *(uint *)(*plVar1 + 4) = node_2._4_4_;
      file_seek((FILE *)__stream_00,offset);
      if (*(uint *)(*plVar1 + 0x28) < 7) {
        file_write((FILE *)__stream_00,(void *)*plVar1,0x40);
      }
      else {
        convert_header_to_11((anm_header06_t *)*plVar1);
        file_write((FILE *)__stream_00,(void *)*plVar1,0x40);
        convert_header_to_old((anm_header06_t *)*plVar1);
      }
      for (sprite_count = 0; sprite_count < (uint)node_1; sprite_count = sprite_count + 1) {
        node_6._4_4_ = ((int)lVar9 - iVar4) + sprite_count * 0x14;
        file_write((FILE *)__stream_00,(void *)((long)&node_6 + 4),4);
      }
      for (local_b0 = (undefined8 *)plVar1[6]; local_b0 != (undefined8 *)0x0;
          local_b0 = (undefined8 *)*local_b0) {
        file_write((FILE *)__stream_00,*(void **)local_b0[2],8);
      }
      file_seek((FILE *)__stream_00,offset + (ulong)*(uint *)(*plVar1 + 0x38));
    }
    fclose(__stream_00);
    return;
  }
  piVar6 = __errno_location();
  pcVar7 = strerror(*piVar6);
  fprintf(__stream,"%s: couldn\'t open %s for writing: %s\n",pcVar5,filename,pcVar7);
  exit(1);
}

Assistant:

static void
anm_write(
    anm_archive_t* anm,
    const char* filename)
{
    FILE* stream;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        sprite_t* sprite;
        anm_script_t* script;
        long base = file_tell(stream);
        unsigned int namepad = 0;
        static const char padding[16] = "";
        unsigned int j;
        unsigned int spriteoffset;

        namepad = (16 - strlen(entry->name) % 16);

        unsigned int sprite_count = 0;
        list_for_each(&entry->sprites, sprite)
            ++sprite_count;

        unsigned int script_count = 0;
        list_for_each(&entry->scripts, script)
            ++script_count;

        file_seek(stream, base +
                          sizeof(anm_header06_t) +
                          sprite_count * sizeof(uint32_t) +
                          script_count * sizeof(anm_offset_t));

        entry->header->nameoffset = file_tell(stream) - base;
        file_write(stream, entry->name, strlen(entry->name));
        file_write(stream, padding, namepad);

        if (entry->name2 && entry->header->version == 0) {
            namepad = (16 - strlen(entry->name2) % 16);

            entry->header->y = file_tell(stream) - base;
            file_write(stream, entry->name2, strlen(entry->name2));
            file_write(stream, padding, namepad);
        }

        spriteoffset = file_tell(stream) - base;

        list_for_each(&entry->sprites, sprite)
            file_write(stream, sprite, sizeof(*sprite));

        list_for_each(&entry->scripts, script) {
            script->offset->offset = file_tell(stream) - base;

            anm_instr_t* instr;
            list_for_each(&script->instrs, instr) {
                if (entry->header->version == 0) {
                    anm_instr0_t new_instr;
                    new_instr.time = instr->time;
                    new_instr.type = instr->type;
                    new_instr.length = instr->length;
                    file_write(stream, &new_instr, sizeof(new_instr));
                    if (new_instr.length) {
                        file_write(stream,
                            instr->data,
                            new_instr.length);
                    }
                } else {
                    if (instr->type == 0xffff) {
                        instr->length = 0;
                        file_write(stream, instr, sizeof(*instr));
                    } else {
                        instr->length += sizeof(*instr);
                        file_write(stream, instr, instr->length);
                    }
                }
            }

            if (entry->header->version == 0) {
                anm_instr0_t sentinel = { 0, 0, 0 };
                file_write(stream, &sentinel, sizeof(sentinel));
            } else {
                anm_instr_t sentinel = { 0xffff, 0, 0, 0 };
                file_write(stream, &sentinel, sizeof(sentinel));
            }
        }

        if (entry->header->hasdata) {
            entry->header->thtxoffset = file_tell(stream) - base;

            file_write(stream, entry->thtx, sizeof(thtx_header_t));
            file_write(stream, entry->data, entry->thtx->size);
        }

        if (list_is_last_iteration())
            entry->header->nextoffset = 0;
        else
            entry->header->nextoffset = file_tell(stream) - base;

        entry->header->sprites = sprite_count;
        entry->header->scripts = script_count;

        file_seek(stream, base);

        if (entry->header->version >= 7) {
            convert_header_to_11(entry->header);
            file_write(stream, entry->header, sizeof(anm_header06_t));
            convert_header_to_old(entry->header);
        } else {
            file_write(stream, entry->header, sizeof(anm_header06_t));
        }

        for (j = 0; j < sprite_count; ++j) {
            uint32_t ofs = spriteoffset + j * sizeof(sprite_t);
            file_write(stream, &ofs, sizeof(uint32_t));
        }

        list_for_each(&entry->scripts, script) {
            file_write(stream, script->offset, sizeof(*script->offset));
        }

        file_seek(stream, base + entry->header->nextoffset);
    }

    fclose(stream);
}